

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>
::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>::str_writer<fmt::v5::char8_t>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>
           *this,align_spec *spec,str_writer<fmt::v5::char8_t> *f)

{
  byte bVar1;
  undefined8 *puVar2;
  long lVar3;
  size_t sVar4;
  size_t sVar5;
  size_t __n;
  size_t sVar6;
  size_t size;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  basic_buffer<fmt::v5::char8_t> *c;
  basic_string_view<fmt::v5::char8_t> s;
  
  uVar9 = (ulong)spec->width_;
  sVar6 = f->size_;
  sVar5 = sVar6;
  if (uVar9 != 0) {
    s.size_ = sVar6;
    s.data_ = f->s;
    sVar5 = internal::count_code_points(s);
  }
  puVar2 = *(undefined8 **)this;
  lVar3 = puVar2[2];
  __n = uVar9 - sVar5;
  if (uVar9 < sVar5 || __n == 0) {
    uVar9 = sVar6 + lVar3;
    if ((ulong)puVar2[3] < uVar9) {
      (**(code **)*puVar2)(puVar2,uVar9);
    }
    puVar2[2] = uVar9;
    sVar6 = f->size_;
    if (sVar6 != 0) {
      pvVar7 = (void *)(lVar3 + puVar2[1]);
LAB_00214280:
      memmove(pvVar7,f->s,sVar6);
      return;
    }
  }
  else {
    uVar8 = ((sVar6 + uVar9) - sVar5) + lVar3;
    if ((ulong)puVar2[3] < uVar8) {
      (**(code **)*puVar2)(puVar2,uVar8);
    }
    puVar2[2] = uVar8;
    pvVar7 = (void *)(lVar3 + puVar2[1]);
    bVar1 = (byte)spec->fill_;
    if (spec->align_ == ALIGN_CENTER) {
      uVar8 = __n >> 1;
      if (1 < __n) {
        memset(pvVar7,(uint)bVar1,uVar8);
        pvVar7 = (void *)((long)pvVar7 + uVar8);
      }
      sVar4 = f->size_;
      if (sVar4 != 0) {
        memmove(pvVar7,f->s,sVar4);
      }
      if (uVar9 != sVar5) {
        __n = __n - uVar8;
        pvVar7 = (void *)((long)pvVar7 + sVar4);
LAB_00214331:
        memset(pvVar7,(uint)bVar1,__n);
        return;
      }
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      if (uVar9 != sVar5) {
        memset(pvVar7,(uint)bVar1,__n);
        pvVar7 = (void *)((long)pvVar7 + __n);
      }
      sVar6 = f->size_;
      if (sVar6 != 0) goto LAB_00214280;
    }
    else {
      sVar4 = f->size_;
      if (sVar4 != 0) {
        memmove(pvVar7,f->s,sVar4);
      }
      if (uVar9 != sVar5) {
        pvVar7 = (void *)((long)pvVar7 + sVar4);
        goto LAB_00214331;
      }
    }
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }